

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O2

void __thiscall
crnlib::
hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>
::move_into(hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>
            *this,node *pNode)

{
  raw_node *prVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  raw_node *prVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  uVar5 = hash_key(this,(vec<6U,_float> *)pNode);
  prVar1 = (this->m_values).m_p;
  prVar6 = prVar1 + uVar5;
  if (prVar1[uVar5].m_bits[0x1c] != '\0') {
    uVar7 = (this->m_values).m_size - 1;
    uVar9 = uVar5;
    do {
      uVar8 = uVar9 - 1;
      if (uVar9 == 0) {
        uVar8 = uVar7;
      }
      if (uVar8 == uVar5) {
        return;
      }
      prVar6 = prVar6 + -1;
      if (uVar9 == 0) {
        prVar6 = prVar1 + uVar7;
      }
      uVar9 = uVar8;
    } while (prVar6->m_bits[0x1c] != '\0');
  }
  uVar2 = *(undefined8 *)(pNode->super_value_type).first.m_s;
  uVar3 = *(undefined8 *)((pNode->super_value_type).first.m_s + 2);
  uVar4 = *(undefined8 *)&(pNode->super_value_type).second;
  *(undefined8 *)(prVar6->m_bits + 0x10) = *(undefined8 *)((pNode->super_value_type).first.m_s + 4);
  *(undefined8 *)(prVar6->m_bits + 0x18) = uVar4;
  *(undefined8 *)prVar6->m_bits = uVar2;
  *(undefined8 *)(prVar6->m_bits + 8) = uVar3;
  pNode->state = '\0';
  this->m_num_valid = this->m_num_valid + 1;
  return;
}

Assistant:

inline void move_into(node* pNode)
        {
            int index = hash_key(pNode->first);
            node* pDst_node = &get_node(index);

            if (pDst_node->state)
            {
                const int orig_index = index;

                for (;;)
                {
                    if (!index)
                    {
                        index = m_values.size() - 1;
                        pDst_node = &get_node(index);
                    }
                    else
                    {
                        index--;
                        pDst_node--;
                    }

                    if (index == orig_index)
                    {
                        CRNLIB_ASSERT(false);
                        return;
                    }

                    if (!pDst_node->state)
                    {
                        break;
                    }
                }
            }

            move_node(pDst_node, pNode);

            m_num_valid++;
        }